

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_bool32 ma_context_get_device_info_enum_callback__alsa
                    (ma_context *pContext,ma_device_type deviceType,ma_device_info *pDeviceInfo,
                    void *pUserData)

{
  ma_device_id *pID0;
  int iVar1;
  ma_bool32 mVar2;
  
  if (pUserData == (void *)0x0) {
    __assert_fail("pData != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x41f3,
                  "ma_bool32 ma_context_get_device_info_enum_callback__alsa(ma_context *, ma_device_type, const ma_device_info *, void *)"
                 );
  }
  pID0 = *(ma_device_id **)((long)pUserData + 8);
  if (pID0 == (ma_device_id *)0x0) {
    iVar1 = ma_strcmp((char *)pDeviceInfo,"default");
    if (iVar1 != 0) goto LAB_00106b48;
  }
  else {
LAB_00106b48:
    if (*pUserData != deviceType) goto LAB_00106b84;
    mVar2 = ma_context_is_device_id_equal__alsa(pContext,pID0,&pDeviceInfo->id);
    if (mVar2 == 0) goto LAB_00106b84;
  }
  ma_strncpy_s((char *)(*(long *)((long)pUserData + 0x18) + 0x100),0x100,pDeviceInfo->name,
               0xffffffffffffffff);
  *(undefined4 *)((long)pUserData + 0x20) = 1;
LAB_00106b84:
  return (uint)(*(int *)((long)pUserData + 0x20) == 0);
}

Assistant:

static ma_bool32 ma_context_get_device_info_enum_callback__alsa(ma_context* pContext, ma_device_type deviceType, const ma_device_info* pDeviceInfo, void* pUserData)
{
    ma_context_get_device_info_enum_callback_data__alsa* pData = (ma_context_get_device_info_enum_callback_data__alsa*)pUserData;
    MA_ASSERT(pData != NULL);

    if (pData->pDeviceID == NULL && ma_strcmp(pDeviceInfo->id.alsa, "default") == 0) {
        ma_strncpy_s(pData->pDeviceInfo->name, sizeof(pData->pDeviceInfo->name), pDeviceInfo->name, (size_t)-1);
        pData->foundDevice = MA_TRUE;
    } else {
        if (pData->deviceType == deviceType && ma_context_is_device_id_equal__alsa(pContext, pData->pDeviceID, &pDeviceInfo->id)) {
            ma_strncpy_s(pData->pDeviceInfo->name, sizeof(pData->pDeviceInfo->name), pDeviceInfo->name, (size_t)-1);
            pData->foundDevice = MA_TRUE;
        }
    }

    /* Keep enumerating until we have found the device. */
    return !pData->foundDevice;
}